

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug operator<<(QDebug debug,QSharedPointer<char> *ptr)

{
  char *pcVar1;
  QTextStream *pQVar2;
  storage_type *psVar3;
  long *in_RDX;
  storage_type *psVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)ptr);
  pQVar2 = (QTextStream *)(ptr->value).ptr;
  pQVar2[0x30] = (QTextStream)0x0;
  QVar5.m_data = (storage_type *)0xf;
  QVar5.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar2,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(ptr->value).ptr;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pQVar2 = (QTextStream *)(ptr->value).ptr;
  if (*in_RDX == 0) {
    psVar4 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar4 = psVar3 + 1;
      pcVar1 = psVar3 + *in_RDX + 1;
      psVar3 = psVar4;
    } while (*pcVar1 != '\0');
  }
  QVar6.m_data = psVar4;
  QVar6.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar2,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(ptr->value).ptr;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pQVar2 = (QTextStream *)(ptr->value).ptr;
  QVar7.m_data = (storage_type *)0x1;
  QVar7.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<(pQVar2,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(ptr->value).ptr;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pcVar1 = (ptr->value).ptr;
  (ptr->value).ptr = (char *)0x0;
  *(char **)debug.stream = pcVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

inline QDebug operator<<(QDebug debug, const QSharedPointer<T> &ptr)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QSharedPointer(" << ptr.data() << ")";
    return debug;
}